

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

Value * __thiscall xmrig::JsonReader::getValue(JsonReader *this,char *key)

{
  Value *pVVar1;
  char *in_RSI;
  Value *in_RDI;
  
  pVVar1 = Json::getValue(in_RDI,in_RSI);
  return pVVar1;
}

Assistant:

inline const rapidjson::Value &getValue(const char *key) const override                          { return Json::getValue(m_obj, key); }